

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O2

bool bssl::tls13_add_certificate(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  ssl_credential_st *psVar1;
  ssl_credential_st *this;
  ssl_ctx_st *psVar2;
  CertCompressionAlg *pCVar3;
  SSL_HANDSHAKE_HINTS *pSVar4;
  uchar *__first1;
  Span<const_unsigned_char> in;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  CRYPTO_BUFFER *pCVar9;
  uint8_t *puVar10;
  size_t sVar11;
  long lVar12;
  CBB *cbb_00;
  ulong i;
  Span<const_unsigned_char> in_00;
  CBB compressed;
  CBB extensions;
  Array<unsigned_char> msg;
  ScopedCBB cbb;
  CBB certificate_list;
  CBB body_storage;
  CBB leaf;
  
  ssl = hs->ssl;
  psVar1 = (hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
  CBB_zero(&cbb.ctx_);
  if ((hs->field_0x6ca & 0x20) == 0) {
    cbb_00 = &body_storage;
    bVar5 = (*ssl->method->init_message)(ssl,&cbb.ctx_,cbb_00,'\v');
    if (bVar5) {
LAB_00235017:
      iVar8 = CBB_add_u8(cbb_00,'\0');
      if ((iVar8 == 0) ||
         (iVar8 = CBB_add_u24_length_prefixed(cbb_00,&certificate_list), iVar8 == 0)) {
        bVar5 = false;
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1ae);
        goto LAB_002353f7;
      }
      this = (hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>
             ._M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
      if (this == (ssl_credential_st *)0x0) {
        bVar5 = ssl_add_message_cbb(ssl,&cbb.ctx_);
        goto LAB_002353f7;
      }
      bVar5 = ssl_credential_st::UsesX509(this);
      if (!bVar5) {
        __assert_fail("hs->credential->UsesX509()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                      ,0x1b6,"bool bssl::tls13_add_certificate(SSL_HANDSHAKE *)");
      }
      pCVar9 = (CRYPTO_BUFFER *)
               OPENSSL_sk_value((OPENSSL_STACK *)
                                (psVar1->chain)._M_t.
                                super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                ,0);
      iVar8 = CBB_add_u24_length_prefixed(&certificate_list,&leaf);
      if (iVar8 != 0) {
        puVar10 = CRYPTO_BUFFER_data(pCVar9);
        sVar11 = CRYPTO_BUFFER_len(pCVar9);
        iVar8 = CBB_add_bytes(&leaf,puVar10,sVar11);
        if ((iVar8 != 0) &&
           (iVar8 = CBB_add_u16_length_prefixed(&certificate_list,&extensions), iVar8 != 0)) {
          cVar6 = (char)*(uint *)&hs->field_0x6c8;
          if (((*(uint *)&hs->field_0x6c8 & 4) != 0) &&
             ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
              *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
               &(psVar1->signed_cert_timestamp_list)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
              (crypto_buffer_st *)0x0)) {
            iVar8 = CBB_add_u16(&extensions,0x12);
            if ((iVar8 != 0) &&
               (iVar8 = CBB_add_u16_length_prefixed(&extensions,&compressed), iVar8 != 0)) {
              puVar10 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                           (psVar1->signed_cert_timestamp_list)._M_t.
                                           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                          );
              sVar11 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                         (psVar1->signed_cert_timestamp_list)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        );
              iVar8 = CBB_add_bytes(&compressed,puVar10,sVar11);
              if ((iVar8 != 0) && (iVar8 = CBB_flush(&extensions), iVar8 != 0)) {
                cVar6 = (char)*(undefined4 *)&hs->field_0x6c8;
                goto LAB_00235151;
              }
            }
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                          ,0x1ca);
            goto LAB_002353f5;
          }
LAB_00235151:
          if ((cVar6 < '\0') &&
             ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
              *(_Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter> *)
               &(psVar1->ocsp_response)._M_t.
                super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> !=
              (crypto_buffer_st *)0x0)) {
            iVar8 = CBB_add_u16(&extensions,5);
            if ((iVar8 != 0) &&
               (((iVar8 = CBB_add_u16_length_prefixed(&extensions,&compressed), iVar8 != 0 &&
                 (iVar8 = CBB_add_u8(&compressed,'\x01'), iVar8 != 0)) &&
                (iVar8 = CBB_add_u24_length_prefixed(&compressed,(CBB *)&msg), iVar8 != 0)))) {
              puVar10 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                           (psVar1->ocsp_response)._M_t.
                                           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                          );
              sVar11 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                         (psVar1->ocsp_response)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        );
              iVar8 = CBB_add_bytes((CBB *)&msg,puVar10,sVar11);
              if ((iVar8 != 0) && (iVar8 = CBB_flush(&extensions), iVar8 != 0)) goto LAB_002351f5;
            }
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                          ,0x1d9);
            goto LAB_002353f5;
          }
LAB_002351f5:
          if (psVar1->type == kDelegated) {
            iVar8 = CBB_add_u16(&extensions,0x22);
            if ((iVar8 != 0) &&
               (iVar8 = CBB_add_u16_length_prefixed(&extensions,&compressed), iVar8 != 0)) {
              puVar10 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                           (psVar1->dc)._M_t.
                                           super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                          );
              sVar11 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                         (psVar1->dc)._M_t.
                                         super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                        );
              iVar8 = CBB_add_bytes(&compressed,puVar10,sVar11);
              if ((iVar8 != 0) && (iVar8 = CBB_flush(&extensions), iVar8 != 0)) goto LAB_00235263;
            }
            ERR_put_error(0x10,0,0x44,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                          ,0x1e5);
          }
          else {
LAB_00235263:
            if (((hs->field_0x6cb & 4) == 0) ||
               (((iVar8 = CBB_add_u16(&extensions,0xca34), iVar8 != 0 &&
                 (iVar8 = CBB_add_u16_length_prefixed(&extensions,&compressed), iVar8 != 0)) &&
                (iVar8 = CBB_flush(&extensions), iVar8 != 0)))) {
              for (i = 1; sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)
                                                  (psVar1->chain)._M_t.
                                                  super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                                 ), i < sVar11; i = i + 1) {
                pCVar9 = (CRYPTO_BUFFER *)
                         OPENSSL_sk_value((OPENSSL_STACK *)
                                          (psVar1->chain)._M_t.
                                          super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                          ,i);
                iVar8 = CBB_add_u24_length_prefixed(&certificate_list,&compressed);
                if (iVar8 == 0) {
LAB_002353db:
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x1fb);
                  goto LAB_002353f5;
                }
                puVar10 = CRYPTO_BUFFER_data(pCVar9);
                sVar11 = CRYPTO_BUFFER_len(pCVar9);
                iVar8 = CBB_add_bytes(&compressed,puVar10,sVar11);
                if ((iVar8 == 0) || (iVar8 = CBB_add_u16(&certificate_list,0), iVar8 == 0))
                goto LAB_002353db;
              }
              if ((hs->field_0x6ca & 0x20) == 0) {
                bVar5 = ssl_add_message_cbb(ssl,&cbb.ctx_);
              }
              else {
                msg.data_ = (uchar *)0x0;
                msg.size_ = 0;
                bVar5 = CBBFinishArray(&cbb.ctx_,&msg);
                if (bVar5) {
                  psVar2 = (ssl->ctx)._M_t.
                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
                  pCVar3 = (psVar2->cert_compression_algs).data_;
                  for (lVar12 = 0; (psVar2->cert_compression_algs).size_ * 0x18 - lVar12 != 0;
                      lVar12 = lVar12 + 0x18) {
                    if (*(uint16_t *)((long)&pCVar3->alg_id + lVar12) == hs->cert_compression_alg_id
                       ) {
                      if (*(long *)((long)&pCVar3->compress + lVar12) != 0) {
                        bVar5 = (*ssl->method->init_message)(ssl,&cbb.ctx_,&body_storage,'\x19');
                        if (((!bVar5) ||
                            (iVar8 = CBB_add_u16(&body_storage,hs->cert_compression_alg_id),
                            iVar8 == 0)) ||
                           ((0xffffff < msg.size_ ||
                            ((iVar8 = CBB_add_u24(&body_storage,(uint32_t)msg.size_), iVar8 == 0 ||
                             (iVar8 = CBB_add_u24_length_prefixed(&body_storage,&compressed),
                             iVar8 == 0)))))) {
                          bVar5 = false;
                          ERR_put_error(0x10,0,0x44,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                        ,0x21f);
                          goto LAB_002355f3;
                        }
                        pSVar4 = (hs->hints)._M_t.
                                 super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>.
                                 _M_head_impl;
                        if ((pSVar4 == (SSL_HANDSHAKE_HINTS *)0x0) ||
                           (((((hs->field_0x6ca & 0x10) != 0 ||
                              (pSVar4->cert_compression_alg_id != hs->cert_compression_alg_id)) ||
                             (__first1 = (pSVar4->cert_compression_input).data_,
                             bVar5 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                                               (__first1,__first1 +
                                                         (pSVar4->cert_compression_input).size_,
                                                msg.data_,msg.data_ + msg.size_), !bVar5)) ||
                            (sVar11 = (pSVar4->cert_compression_output).size_, sVar11 == 0)))) {
                          iVar8 = (**(code **)((long)&pCVar3->compress + lVar12))
                                            (ssl,&compressed,msg.data_,msg.size_);
                          if (iVar8 == 0) {
                            iVar8 = 0x22f;
                          }
                          else {
                            if ((pSVar4 != (SSL_HANDSHAKE_HINTS *)0x0) &&
                               ((hs->field_0x6ca & 0x10) != 0)) {
                              pSVar4->cert_compression_alg_id = hs->cert_compression_alg_id;
                              in.size_ = msg.size_;
                              in.data_ = msg.data_;
                              bVar5 = Array<unsigned_char>::CopyFrom
                                                (&pSVar4->cert_compression_input,in);
                              if (bVar5) {
                                puVar10 = CBB_data(&compressed);
                                sVar11 = CBB_len(&compressed);
                                in_00.size_ = sVar11;
                                in_00.data_ = puVar10;
                                bVar5 = Array<unsigned_char>::CopyFrom
                                                  (&pSVar4->cert_compression_output,in_00);
                                if (bVar5) goto LAB_00235629;
                              }
                              bVar5 = false;
                              goto LAB_002355f3;
                            }
LAB_00235629:
                            bVar7 = ssl_add_message_cbb(ssl,&cbb.ctx_);
                            iVar8 = 0x23d;
                            bVar5 = true;
                            if (bVar7) goto LAB_002355f3;
                          }
                        }
                        else {
                          iVar8 = CBB_add_bytes(&compressed,(pSVar4->cert_compression_output).data_,
                                                sVar11);
                          if (iVar8 != 0) goto LAB_00235629;
                          iVar8 = 0x22a;
                        }
                        bVar5 = false;
                        ERR_put_error(0x10,0,0x44,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                      ,iVar8);
                        goto LAB_002355f3;
                      }
                      break;
                    }
                  }
                  bVar5 = false;
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x213);
                }
                else {
                  bVar5 = false;
                  ERR_put_error(0x10,0,0x44,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                                ,0x206);
                }
LAB_002355f3:
                Array<unsigned_char>::~Array(&msg);
              }
              goto LAB_002353f7;
            }
          }
          goto LAB_002353f5;
        }
      }
      bVar5 = false;
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                    ,0x1bd);
      goto LAB_002353f7;
    }
  }
  else {
    cbb_00 = &cbb.ctx_;
    iVar8 = CBB_init(cbb_00,0x400);
    if (iVar8 != 0) goto LAB_00235017;
  }
LAB_002353f5:
  bVar5 = false;
LAB_002353f7:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  return bVar5;
}

Assistant:

bool tls13_add_certificate(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  const SSL_CREDENTIAL *cred = hs->credential.get();

  ScopedCBB cbb;
  CBB *body, body_storage, certificate_list;

  if (hs->cert_compression_negotiated) {
    if (!CBB_init(cbb.get(), 1024)) {
      return false;
    }
    body = cbb.get();
  } else {
    body = &body_storage;
    if (!ssl->method->init_message(ssl, cbb.get(), body, SSL3_MT_CERTIFICATE)) {
      return false;
    }
  }

  if (  // The request context is always empty in the handshake.
      !CBB_add_u8(body, 0) ||
      !CBB_add_u24_length_prefixed(body, &certificate_list)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (hs->credential == nullptr) {
    return ssl_add_message_cbb(ssl, cbb.get());
  }

  assert(hs->credential->UsesX509());
  CRYPTO_BUFFER *leaf_buf = sk_CRYPTO_BUFFER_value(cred->chain.get(), 0);
  CBB leaf, extensions;
  if (!CBB_add_u24_length_prefixed(&certificate_list, &leaf) ||
      !CBB_add_bytes(&leaf, CRYPTO_BUFFER_data(leaf_buf),
                     CRYPTO_BUFFER_len(leaf_buf)) ||
      !CBB_add_u16_length_prefixed(&certificate_list, &extensions)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (hs->scts_requested && cred->signed_cert_timestamp_list != nullptr) {
    CBB contents;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_certificate_timestamp) ||
        !CBB_add_u16_length_prefixed(&extensions, &contents) ||
        !CBB_add_bytes(
            &contents,
            CRYPTO_BUFFER_data(cred->signed_cert_timestamp_list.get()),
            CRYPTO_BUFFER_len(cred->signed_cert_timestamp_list.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (hs->ocsp_stapling_requested && cred->ocsp_response != NULL) {
    CBB contents, ocsp_response;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_status_request) ||
        !CBB_add_u16_length_prefixed(&extensions, &contents) ||
        !CBB_add_u8(&contents, TLSEXT_STATUSTYPE_ocsp) ||
        !CBB_add_u24_length_prefixed(&contents, &ocsp_response) ||
        !CBB_add_bytes(&ocsp_response,
                       CRYPTO_BUFFER_data(cred->ocsp_response.get()),
                       CRYPTO_BUFFER_len(cred->ocsp_response.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (cred->type == SSLCredentialType::kDelegated) {
    CBB child;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_delegated_credential) ||
        !CBB_add_u16_length_prefixed(&extensions, &child) ||
        !CBB_add_bytes(&child, CRYPTO_BUFFER_data(cred->dc.get()),
                       CRYPTO_BUFFER_len(cred->dc.get())) ||
        !CBB_flush(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (hs->matched_peer_trust_anchor) {
    // Let the peer know we matched a requested trust anchor.
    CBB empty_contents;
    if (!CBB_add_u16(&extensions, TLSEXT_TYPE_trust_anchors) ||        //
        !CBB_add_u16_length_prefixed(&extensions, &empty_contents) ||  //
        !CBB_flush(&extensions)) {
      return false;
    }
  }

  for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(cred->chain.get()); i++) {
    CRYPTO_BUFFER *cert_buf = sk_CRYPTO_BUFFER_value(cred->chain.get(), i);
    CBB child;
    if (!CBB_add_u24_length_prefixed(&certificate_list, &child) ||
        !CBB_add_bytes(&child, CRYPTO_BUFFER_data(cert_buf),
                       CRYPTO_BUFFER_len(cert_buf)) ||
        !CBB_add_u16(&certificate_list, 0 /* no extensions */)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }

  if (!hs->cert_compression_negotiated) {
    return ssl_add_message_cbb(ssl, cbb.get());
  }

  Array<uint8_t> msg;
  if (!CBBFinishArray(cbb.get(), &msg)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const CertCompressionAlg *alg = nullptr;
  for (const auto &candidate : ssl->ctx->cert_compression_algs) {
    if (candidate.alg_id == hs->cert_compression_alg_id) {
      alg = &candidate;
      break;
    }
  }

  if (alg == nullptr || alg->compress == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  CBB compressed;
  body = &body_storage;
  if (!ssl->method->init_message(ssl, cbb.get(), body,
                                 SSL3_MT_COMPRESSED_CERTIFICATE) ||
      !CBB_add_u16(body, hs->cert_compression_alg_id) ||
      msg.size() > (1u << 24) - 1 ||  //
      !CBB_add_u24(body, static_cast<uint32_t>(msg.size())) ||
      !CBB_add_u24_length_prefixed(body, &compressed)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (hints && !hs->hints_requested &&
      hints->cert_compression_alg_id == hs->cert_compression_alg_id &&
      hints->cert_compression_input == Span(msg) &&
      !hints->cert_compression_output.empty()) {
    if (!CBB_add_bytes(&compressed, hints->cert_compression_output.data(),
                       hints->cert_compression_output.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  } else {
    if (!alg->compress(ssl, &compressed, msg.data(), msg.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    if (hints && hs->hints_requested) {
      hints->cert_compression_alg_id = hs->cert_compression_alg_id;
      if (!hints->cert_compression_input.CopyFrom(msg) ||
          !hints->cert_compression_output.CopyFrom(
              Span(CBB_data(&compressed), CBB_len(&compressed)))) {
        return false;
      }
    }
  }

  if (!ssl_add_message_cbb(ssl, cbb.get())) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}